

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestPackage.cpp
# Opt level: O3

int __thiscall deqp::TestPackage::init(TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  PackageContext *this_00;
  
  this_00 = (PackageContext *)operator_new(0x38);
  PackageContext::PackageContext
            (this_00,(this->super_TestPackage).super_TestNode.m_testCtx,
             (ContextType)(this->m_renderContextType).super_ApiType.m_bits);
  this->m_packageCtx = this_00;
  return extraout_EAX;
}

Assistant:

void TestPackage::init(void)
{
	try
	{
		// Create context
		m_packageCtx = new PackageContext(m_testCtx, m_renderContextType);
	}
	catch (...)
	{
		delete m_packageCtx;
		m_packageCtx = DE_NULL;

		throw;
	}
}